

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall TidyConfigParser::parseChecks(TidyConfigParser *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  size_type sVar6;
  long in_RDI;
  bool checkParsed;
  char currentChar;
  string checkName;
  string checkGroup;
  bool ruleParsed;
  bool checkGroupParsed;
  CheckStatus newCheckState;
  CheckStatus in_stack_fffffffffffff85c;
  int in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  TidyConfigParser *in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  char in_stack_fffffffffffff874;
  char in_stack_fffffffffffff875;
  char in_stack_fffffffffffff876;
  char in_stack_fffffffffffff877;
  undefined2 in_stack_fffffffffffff880;
  char in_stack_fffffffffffff882;
  char in_stack_fffffffffffff883;
  char in_stack_fffffffffffff884;
  char in_stack_fffffffffffff885;
  char in_stack_fffffffffffff886;
  char in_stack_fffffffffffff887;
  undefined4 in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  char *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  undefined1 local_758 [8];
  string *in_stack_fffffffffffff8b0;
  TidyConfigParser *in_stack_fffffffffffff8b8;
  allocator<char> local_731 [29];
  CheckStatus in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  char *in_stack_fffffffffffff8f8;
  undefined1 local_6f8 [36];
  int local_6d4;
  char *local_6d0;
  undefined8 local_6c8;
  undefined1 local_6c0 [36];
  int local_69c;
  char *local_698;
  undefined8 local_690;
  undefined1 local_688 [36];
  int local_664;
  char *local_660;
  undefined8 local_658;
  undefined1 local_650 [4];
  CheckStatus in_stack_fffffffffffff9b4;
  string *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c0;
  TidyConfigParser *in_stack_fffffffffffff9c8;
  allocator<char> local_629 [37];
  int local_604;
  char *local_600;
  undefined8 local_5f8;
  undefined1 local_5f0 [36];
  int local_5cc;
  char *local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8 [36];
  int local_594;
  char *local_590;
  undefined8 local_588;
  undefined1 local_580 [32];
  int local_560;
  char local_549 [9];
  format_args in_stack_fffffffffffffac0;
  string_view in_stack_fffffffffffffad0;
  int local_4f8 [4];
  char local_4e8 [16];
  undefined8 local_4d8;
  int *local_4d0;
  char *local_4c8;
  undefined8 uStack_4c0;
  char *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  undefined8 uStack_498;
  undefined1 *local_490;
  int local_488 [4];
  char local_478 [16];
  undefined8 local_468;
  int *local_460;
  char *local_458;
  undefined8 uStack_450;
  char *local_440;
  undefined1 *local_438;
  char *local_430;
  undefined8 uStack_428;
  undefined1 *local_420;
  int local_418 [4];
  char local_408 [16];
  undefined8 local_3f8;
  int *local_3f0;
  char *local_3e8;
  undefined8 uStack_3e0;
  char *local_3d0;
  int *local_3c8;
  char *local_3c0;
  undefined8 uStack_3b8;
  undefined1 *local_3b0;
  int local_3a8 [4];
  char local_398 [16];
  undefined8 local_388;
  int *local_380;
  char *local_378;
  undefined8 uStack_370;
  char *local_360;
  int *local_358;
  char *local_350;
  undefined8 uStack_348;
  undefined1 *local_340;
  int local_338 [4];
  char local_328 [16];
  undefined8 local_318;
  int *local_310;
  char *local_308;
  undefined8 uStack_300;
  char *local_2f0;
  int *local_2e8;
  char *local_2e0;
  undefined8 uStack_2d8;
  undefined1 *local_2d0;
  int local_2c8 [4];
  char local_2b8 [16];
  undefined8 local_2a8;
  int *local_2a0;
  char *local_298;
  undefined8 uStack_290;
  char *local_280;
  int *local_278;
  char *local_270;
  undefined8 uStack_268;
  undefined1 *local_260;
  int local_258 [4];
  char local_248 [16];
  undefined8 local_238;
  int *local_230;
  char *local_228;
  undefined8 uStack_220;
  char *local_210;
  int *local_208;
  char *local_200;
  undefined8 uStack_1f8;
  undefined1 *local_1f0;
  int local_1e8 [4];
  char local_1d8 [16];
  undefined8 local_1c8;
  int *local_1c0;
  char *local_1b8;
  undefined8 uStack_1b0;
  char *local_1a8;
  int *local_1a0;
  char *local_198;
  undefined8 uStack_190;
  undefined1 *local_188;
  int local_17c;
  int *local_178;
  int local_16c;
  int *local_168;
  int local_15c;
  int *local_158;
  int local_14c;
  int *local_148;
  int local_13c;
  int *local_138;
  int local_12c;
  int *local_128;
  int local_11c;
  int *local_118;
  int local_10c;
  int *local_108;
  char local_f9;
  char *local_f8;
  char local_e9;
  char *local_e8;
  char local_d9;
  char *local_d8;
  char local_c9;
  char *local_c8;
  char local_b9;
  char *local_b8;
  char local_a9;
  char *local_a8;
  char local_99;
  char *local_98;
  char local_89;
  char *local_88;
  int *local_80;
  undefined8 *local_78;
  int *local_70;
  undefined8 *local_68;
  int *local_60;
  undefined8 *local_58;
  int *local_50;
  undefined8 *local_48;
  int *local_40;
  undefined8 *local_38;
  int *local_30;
  undefined8 *local_28;
  int *local_20;
  undefined8 *local_18;
  int *local_10;
  undefined8 *local_8;
  
LAB_00209a5c:
  bVar3 = std::ios::eof();
  if (((bVar3 ^ 0xff) & 1) == 0) {
    return;
  }
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff887,
                      CONCAT16(in_stack_fffffffffffff886,
                               CONCAT15(in_stack_fffffffffffff885,
                                        CONCAT14(in_stack_fffffffffffff884,
                                                 CONCAT13(in_stack_fffffffffffff883,
                                                          CONCAT12(in_stack_fffffffffffff882,
                                                                   in_stack_fffffffffffff880)))))));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff887,
                      CONCAT16(in_stack_fffffffffffff886,
                               CONCAT15(in_stack_fffffffffffff885,
                                        CONCAT14(in_stack_fffffffffffff884,
                                                 CONCAT13(in_stack_fffffffffffff883,
                                                          CONCAT12(in_stack_fffffffffffff882,
                                                                   in_stack_fffffffffffff880)))))));
  in_stack_fffffffffffff887 = nextChar(in_stack_fffffffffffff868);
  local_549[0] = in_stack_fffffffffffff887;
  while (local_549[0] == '\n') {
    in_stack_fffffffffffff886 = nextChar(in_stack_fffffffffffff868);
    local_549[0] = in_stack_fffffffffffff886;
  }
  if (local_549[0] == '-') {
LAB_0020a10b:
    in_stack_fffffffffffff882 = nextChar(in_stack_fffffffffffff868);
    local_549[0] = in_stack_fffffffffffff882;
    if (in_stack_fffffffffffff882 == '*') {
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffad8);
      if (sVar6 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890))
        ;
        reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        std::allocator<char>::~allocator(local_629);
      }
      bVar1 = true;
      toggleAllChecks((TidyConfigParser *)
                      CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                      in_stack_fffffffffffff85c);
    }
    else if (in_stack_fffffffffffff882 == '-') {
      bVar2 = true;
    }
    else {
      iVar5 = isalpha((int)in_stack_fffffffffffff882);
      if (iVar5 == 0) {
        local_660 = "Expected \'*\' or a letter but found: ({}){}";
        local_658 = 0x2a;
        local_664 = (int)local_549[0];
        local_2d0 = local_650;
        local_2e0 = "Expected \'*\' or a letter but found: ({}){}";
        uStack_2d8 = 0x2a;
        local_2e8 = &local_664;
        local_2f0 = local_549;
        local_308 = "Expected \'*\' or a letter but found: ({}){}";
        uStack_300 = 0x2a;
        local_148 = local_338;
        local_c8 = local_328;
        local_c9 = local_549[0];
        local_48 = &local_318;
        local_318 = 0x81;
        local_14c = local_664;
        local_50 = local_148;
        local_338[0] = local_664;
        local_328[0] = local_c9;
        local_310 = local_148;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
        reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff877,
                            CONCAT16(in_stack_fffffffffffff876,
                                     CONCAT15(in_stack_fffffffffffff875,
                                              CONCAT14(in_stack_fffffffffffff874,
                                                       in_stack_fffffffffffff870)))),
                   (char)((ulong)in_stack_fffffffffffff868 >> 0x38));
      }
    }
    if (bVar1) {
      in_stack_fffffffffffff877 = nextChar(in_stack_fffffffffffff868);
      cVar4 = in_stack_fffffffffffff877;
      if ((in_stack_fffffffffffff877 == '\n') ||
         (cVar4 = in_stack_fffffffffffff877, in_stack_fffffffffffff877 == '\0')) {
        while (local_549[0] = cVar4, in_stack_fffffffffffff876 = peekChar(in_stack_fffffffffffff868)
              , in_stack_fffffffffffff876 == '\n') {
          nextChar(in_stack_fffffffffffff868);
          cVar4 = local_549[0];
        }
        *(undefined4 *)(in_RDI + 0x38) = 0;
        local_560 = 1;
      }
      else {
        cVar4 = in_stack_fffffffffffff877;
        if (in_stack_fffffffffffff877 != ',') {
          local_698 = "Expected \',\' but found: ({}){}";
          local_690 = 0x1e;
          local_69c = (int)in_stack_fffffffffffff877;
          local_340 = local_688;
          local_350 = "Expected \',\' but found: ({}){}";
          uStack_348 = 0x1e;
          local_358 = &local_69c;
          local_360 = local_549;
          local_378 = "Expected \',\' but found: ({}){}";
          uStack_370 = 0x1e;
          local_138 = local_3a8;
          local_b8 = local_398;
          local_b9 = local_549[0];
          local_38 = &local_388;
          local_388 = 0x81;
          local_549[0] = in_stack_fffffffffffff877;
          local_13c = local_69c;
          local_40 = local_138;
          local_3a8[0] = local_69c;
          local_398[0] = local_b9;
          local_380 = local_138;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
          reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          cVar4 = local_549[0];
        }
        local_549[0] = cVar4;
        local_560 = 2;
      }
    }
    else {
      while (!bVar2) {
        in_stack_fffffffffffff875 = nextChar(in_stack_fffffffffffff868);
        local_549[0] = in_stack_fffffffffffff875;
        if (in_stack_fffffffffffff875 == '-') {
          bVar2 = true;
        }
        else {
          iVar5 = isalpha((int)in_stack_fffffffffffff875);
          if (iVar5 == 0) {
            local_6d0 = "Expected \'-\' or a letter but found: ({}){}";
            local_6c8 = 0x2a;
            local_6d4 = (int)local_549[0];
            local_3b0 = local_6c0;
            local_3c0 = "Expected \'-\' or a letter but found: ({}){}";
            uStack_3b8 = 0x2a;
            local_3c8 = &local_6d4;
            local_3d0 = local_549;
            local_3e8 = "Expected \'-\' or a letter but found: ({}){}";
            uStack_3e0 = 0x2a;
            local_128 = local_418;
            local_a8 = local_408;
            local_a9 = local_549[0];
            local_28 = &local_3f8;
            local_3f8 = 0x81;
            local_12c = local_6d4;
            local_30 = local_128;
            local_418[0] = local_6d4;
            local_408[0] = local_a9;
            local_3f0 = local_128;
            ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
            reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffff877,
                               CONCAT16(in_stack_fffffffffffff876,
                                        CONCAT15(in_stack_fffffffffffff875,
                                                 CONCAT14(in_stack_fffffffffffff874,
                                                          in_stack_fffffffffffff870)))),
                      (char)((ulong)in_stack_fffffffffffff868 >> 0x38));
          }
        }
      }
      local_6f8[0x23] = 0;
      while (in_stack_fffffffffffff874 = nextChar(in_stack_fffffffffffff868),
            local_549[0] = in_stack_fffffffffffff874, in_stack_fffffffffffff874 != ',') {
        if (in_stack_fffffffffffff874 == '*') {
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_549 + 1));
          if (sVar6 != 0) {
            in_stack_fffffffffffff868 = (TidyConfigParser *)local_731;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
            reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
            std::allocator<char>::~allocator(local_731);
          }
          toggleAllGroupChecks
                    ((TidyConfigParser *)in_stack_fffffffffffff8f8,
                     (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     in_stack_fffffffffffff8ec);
          local_6f8[0x23] = 1;
        }
        else {
          iVar5 = isalpha((int)in_stack_fffffffffffff874);
          if ((iVar5 == 0) && (local_549[0] != '-')) {
            if ((local_549[0] == '\n') || (local_549[0] == '\0')) goto LAB_0020ab8c;
            in_stack_fffffffffffff898 = "Unexpected ({}){}";
            in_stack_fffffffffffff8a0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
            in_stack_fffffffffffff894 = (int)local_549[0];
            local_490 = local_758;
            local_4a0 = "Unexpected ({}){}";
            uStack_498 = 0x11;
            local_4a8 = &stack0xfffffffffffff894;
            local_4b0 = local_549;
            local_4c8 = "Unexpected ({}){}";
            uStack_4c0 = 0x11;
            local_108 = local_4f8;
            local_88 = local_4e8;
            local_89 = local_549[0];
            local_8 = &local_4d8;
            local_4d8 = 0x81;
            local_10c = in_stack_fffffffffffff894;
            local_10 = local_108;
            local_4f8[0] = in_stack_fffffffffffff894;
            local_4e8[0] = local_89;
            local_4d0 = local_108;
            ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
            reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffff877,
                               CONCAT16(in_stack_fffffffffffff876,
                                        CONCAT15(in_stack_fffffffffffff875,
                                                 CONCAT14(in_stack_fffffffffffff874,
                                                          in_stack_fffffffffffff870)))),
                      (char)((ulong)in_stack_fffffffffffff868 >> 0x38));
          }
        }
      }
      toggleCheck(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                  in_stack_fffffffffffff9b4);
      cVar4 = nextChar(in_stack_fffffffffffff868);
      in_stack_fffffffffffff870 = CONCAT13(cVar4,(int3)in_stack_fffffffffffff870);
      if (cVar4 != '\n') {
        in_stack_fffffffffffff8f8 = "Expected new line but found: ({}){}";
        in_stack_fffffffffffff8f4 = (int)local_549[0];
        local_420 = local_6f8;
        local_430 = "Expected new line but found: ({}){}";
        uStack_428 = 0x23;
        local_438 = &stack0xfffffffffffff8f4;
        local_440 = local_549;
        local_458 = "Expected new line but found: ({}){}";
        uStack_450 = 0x23;
        local_118 = local_488;
        local_98 = local_478;
        local_99 = local_549[0];
        local_18 = &local_468;
        local_468 = 0x81;
        local_11c = in_stack_fffffffffffff8f4;
        local_20 = local_118;
        local_488[0] = in_stack_fffffffffffff8f4;
        local_478[0] = local_99;
        local_460 = local_118;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
        reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
      }
      local_560 = 0;
    }
  }
  else {
    iVar5 = isalpha((int)local_549[0]);
    if (iVar5 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff877,
                          CONCAT16(in_stack_fffffffffffff876,
                                   CONCAT15(in_stack_fffffffffffff875,
                                            CONCAT14(in_stack_fffffffffffff874,
                                                     in_stack_fffffffffffff870)))),
                 (char)((ulong)in_stack_fffffffffffff868 >> 0x38));
      goto LAB_0020a10b;
    }
    if (local_549[0] != '*') {
      local_600 = "Expected \'-\' or \'*\' or a letter but found: ({}){}";
      local_5f8 = 0x31;
      local_604 = (int)local_549[0];
      local_260 = local_5f0;
      local_270 = "Expected \'-\' or \'*\' or a letter but found: ({}){}";
      uStack_268 = 0x31;
      local_278 = &local_604;
      local_280 = local_549;
      local_298 = "Expected \'-\' or \'*\' or a letter but found: ({}){}";
      uStack_290 = 0x31;
      local_158 = local_2c8;
      local_d8 = local_2b8;
      local_d9 = local_549[0];
      local_58 = &local_2a8;
      local_2a8 = 0x81;
      local_15c = local_604;
      local_60 = local_158;
      local_2c8[0] = local_604;
      local_2b8[0] = local_d9;
      local_2a0 = local_158;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
      reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
      goto LAB_0020a10b;
    }
    toggleAllChecks((TidyConfigParser *)
                    CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                    in_stack_fffffffffffff85c);
    in_stack_fffffffffffff885 = nextChar(in_stack_fffffffffffff868);
    cVar4 = in_stack_fffffffffffff885;
    if ((in_stack_fffffffffffff885 == '\n') ||
       (cVar4 = in_stack_fffffffffffff885, in_stack_fffffffffffff885 == '\0')) {
      while (local_549[0] = cVar4, in_stack_fffffffffffff884 = peekChar(in_stack_fffffffffffff868),
            in_stack_fffffffffffff884 == '\n') {
        nextChar(in_stack_fffffffffffff868);
        cVar4 = local_549[0];
      }
      *(undefined4 *)(in_RDI + 0x38) = 0;
      local_560 = 1;
    }
    else {
      if (in_stack_fffffffffffff885 != ',') {
        local_5c8 = "Expected \',\' but found: ({}){}";
        local_5c0 = 0x1e;
        local_5cc = (int)in_stack_fffffffffffff885;
        local_1f0 = local_5b8;
        local_200 = "Expected \',\' but found: ({}){}";
        uStack_1f8 = 0x1e;
        local_208 = &local_5cc;
        local_210 = local_549;
        local_228 = "Expected \',\' but found: ({}){}";
        uStack_220 = 0x1e;
        local_168 = local_258;
        local_e8 = local_248;
        local_e9 = local_549[0];
        local_68 = &local_238;
        local_238 = 0x81;
        local_549[0] = in_stack_fffffffffffff885;
        local_16c = local_5cc;
        local_70 = local_168;
        local_258[0] = local_5cc;
        local_248[0] = local_e9;
        local_230 = local_168;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
        reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        goto LAB_0020a10b;
      }
      local_549[0] = in_stack_fffffffffffff885;
      in_stack_fffffffffffff883 = nextChar(in_stack_fffffffffffff868);
      cVar4 = in_stack_fffffffffffff883;
      if (in_stack_fffffffffffff883 != '\n') {
        local_590 = "Expected new line but found: ({}){}";
        local_588 = 0x23;
        local_594 = (int)in_stack_fffffffffffff883;
        local_188 = local_580;
        local_198 = "Expected new line but found: ({}){}";
        uStack_190 = 0x23;
        local_1a0 = &local_594;
        local_1a8 = local_549;
        local_1b8 = "Expected new line but found: ({}){}";
        uStack_1b0 = 0x23;
        local_178 = local_1e8;
        local_f8 = local_1d8;
        local_f9 = local_549[0];
        local_78 = &local_1c8;
        local_1c8 = 0x81;
        local_549[0] = in_stack_fffffffffffff883;
        local_17c = local_594;
        local_80 = local_178;
        local_1e8[0] = local_594;
        local_1d8[0] = local_f9;
        local_1c0 = local_178;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffac0);
        reportErrorAndExit(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        cVar4 = local_549[0];
      }
      local_549[0] = cVar4;
      local_560 = 2;
    }
  }
  goto LAB_0020ad89;
LAB_0020ab8c:
  while( true ) {
    cVar4 = peekChar(in_stack_fffffffffffff868);
    in_stack_fffffffffffff864 = CONCAT13(cVar4,(int3)in_stack_fffffffffffff864);
    if (cVar4 != '\n') break;
    nextChar(in_stack_fffffffffffff868);
  }
  if ((local_6f8[0x23] & 1) == 0) {
    toggleCheck(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                in_stack_fffffffffffff9b4);
  }
  *(undefined4 *)(in_RDI + 0x38) = 0;
  local_560 = 1;
LAB_0020ad89:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  in_stack_fffffffffffff860 = local_560;
  if ((local_560 != 0) && (local_560 == 1)) {
    return;
  }
  goto LAB_00209a5c;
}

Assistant:

void TidyConfigParser::parseChecks() {
    while (!fileStream.eof()) {
        TidyConfig::CheckStatus newCheckState = TidyConfig::CheckStatus::ENABLED;
        bool checkGroupParsed = false;
        bool ruleParsed = false;
        std::string checkGroup;
        std::string checkName;

        // Get the first char
        char currentChar = nextChar();

        // If it is a new line ignore it and get the following char
        while (currentChar == '\n')
            currentChar = nextChar();

        if (currentChar == '-')
            newCheckState = TidyConfig::CheckStatus::DISABLED;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else if (currentChar == '*') {
            toggleAllChecks(TidyConfig::CheckStatus::ENABLED);
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar == ',') {
                currentChar = nextChar();
                if (currentChar != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                continue;
            }
            else {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
        }
        else {
            reportErrorAndExit(fmt::format("Expected '-' or '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse second char
        currentChar = nextChar();

        if (currentChar == '*') {
            if (checkGroup.size())
                reportErrorAndExit("Unexpected '*'");
            ruleParsed = true;
            toggleAllChecks(TidyConfig::CheckStatus::DISABLED);
        }
        else if (currentChar == '-')
            checkGroupParsed = true;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else {
            reportErrorAndExit(fmt::format("Expected '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        if (ruleParsed) {
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar != ',') {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
            continue;
        }

        // Parse group name
        while (!checkGroupParsed) {
            currentChar = nextChar();
            if (currentChar == '-')
                checkGroupParsed = true;
            else if (isalpha(currentChar))
                checkGroup.push_back(currentChar);
            else {
                reportErrorAndExit(fmt::format("Expected '-' or a letter but found: ({}){}",
                                               +currentChar, currentChar));
            }
        }

        // Parse check name
        bool checkParsed = false;
        while (true) {
            currentChar = nextChar();
            if (currentChar == ',') {
                toggleCheck(checkGroup, checkName, newCheckState);
                if (nextChar() != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                break;
            }
            else if (currentChar == '*') {
                if (checkName.size())
                    reportErrorAndExit("Unexpected '*'");
                toggleAllGroupChecks(checkGroup, newCheckState);
                checkParsed = true;
            }
            else if (isalpha(currentChar) || currentChar == '-') {
                checkName.push_back(currentChar);
            }
            else if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                if (!checkParsed)
                    toggleCheck(checkGroup, checkName, newCheckState);
                parserState = ParserState::Initial;
                return;
            }
            else {
                reportErrorAndExit(fmt::format("Unexpected ({}){}", +currentChar, currentChar));
            }
        }
    }
}